

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsHasExternalData(JsValueRef object,bool *value)

{
  bool bVar1;
  bool bVar2;
  JsErrorCode JVar3;
  DebugCheckNoException local_20;
  DebugCheckNoException __debugCheckNoException;
  
  if (object == (JsValueRef)0x0) {
    JVar3 = JsErrorInvalidArgument;
  }
  else if (value == (bool *)0x0) {
    JVar3 = JsErrorNullArgument;
  }
  else {
    local_20.hasException = true;
    local_20.__exceptionCheck = ExceptionCheck::Save();
    while( true ) {
      bVar1 = Js::VarIs<Js::JavascriptProxy>(object);
      if (!bVar1) break;
      object = Js::UnsafeVarTo<Js::JavascriptProxy>(object);
    }
    bVar1 = Js::VarIs<JsrtExternalObject>(object);
    bVar2 = true;
    if (!bVar1) {
      bVar2 = Js::VarIs<Js::CustomExternalWrapperObject>(object);
    }
    *value = bVar2;
    local_20.hasException = false;
    DebugCheckNoException::~DebugCheckNoException(&local_20);
    JVar3 = JsNoError;
  }
  return JVar3;
}

Assistant:

CHAKRA_API JsHasExternalData(_In_ JsValueRef object, _Out_ bool *value)
{
    VALIDATE_JSREF(object);
    PARAM_NOT_NULL(value);

    BEGIN_JSRT_NO_EXCEPTION
    {
        while (Js::VarIs<Js::JavascriptProxy>(object))
        {
            object = Js::UnsafeVarTo<Js::JavascriptProxy>(object);
        }
        *value = (Js::VarIs<JsrtExternalObject>(object)
#ifdef _CHAKRACOREBUILD
            || Js::VarIs<Js::CustomExternalWrapperObject>(object)
#endif
            );
    }